

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O2

int __thiscall
cmCTest::Run(cmCTest *this,
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *args,string *output)

{
  uint uVar1;
  pointer pbVar2;
  pointer ppcVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  int iVar8;
  int iVar9;
  _Head_base<0UL,_cmCTest::Private_*,_false> _Var10;
  undefined8 unaff_RBP;
  ulong uVar11;
  string *this_00;
  int unaff_R13D;
  pointer ppcVar12;
  bool SRArgumentSpecified;
  ulong local_238;
  uint local_230;
  uint local_22c;
  string arg;
  string errormsg;
  _Vector_base<cmCTestGenericHandler_*,_std::allocator<cmCTestGenericHandler_*>_> local_1e0;
  char *local_1c8 [4];
  string targ;
  
  SRArgumentSpecified = false;
  cmAppend<std::__cxx11::string,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (&((this->Impl)._M_t.
               super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
               super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
               super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl)->
              InitialCommandLineArguments,args);
  uVar11 = CONCAT71((int7)((ulong)unaff_RBP >> 8),1);
  local_238 = 1;
  local_230 = 0;
  do {
    if ((ulong)((long)(args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish -
                (long)(args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start >> 5) <= local_238) {
      _Var10._M_head_impl =
           (this->Impl)._M_t.
           super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
           super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
           super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
      if ((_Var10._M_head_impl)->ParallelLevelSetInCli == false) {
        targ._M_dataplus._M_p = (pointer)&targ.field_2;
        targ._M_string_length = 0;
        targ.field_2._M_local_buf[0] = '\0';
        bVar4 = cmsys::SystemTools::GetEnv("CTEST_PARALLEL_LEVEL",&targ);
        if (bVar4) {
          iVar9 = atoi(targ._M_dataplus._M_p);
          iVar8 = 1;
          if (1 < iVar9) {
            iVar8 = iVar9;
          }
          ((this->Impl)._M_t.
           super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
           super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
           super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl)->ParallelLevel = iVar8;
        }
        std::__cxx11::string::~string((string *)&targ);
        _Var10._M_head_impl =
             (this->Impl)._M_t.
             super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
             super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
             super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
      }
      if (((_Var10._M_head_impl)->TestProgressOutput == true) &&
         ((_Var10._M_head_impl)->OutputLogFile == (cmGeneratedFileStream *)0x0)) {
        bVar4 = ConsoleIsNotDumb();
        _Var10._M_head_impl =
             (this->Impl)._M_t.
             super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
             super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
             super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
      }
      else {
        bVar4 = false;
      }
      (_Var10._M_head_impl)->TestProgressOutput = bVar4;
      if ((local_230 & 1) == 0) {
        if ((uVar11 & 1) == 0) {
          iVar8 = 1;
        }
        else {
          iVar8 = ExecuteTests(this);
        }
      }
      else {
        iVar8 = RunCMakeAndTest(this,output);
      }
      return iVar8;
    }
    errormsg._M_dataplus._M_p = (pointer)&errormsg.field_2;
    errormsg._M_string_length = 0;
    errormsg.field_2._M_local_buf[0] = '\0';
    bVar4 = HandleCommandLineArguments(this,&local_238,args,&errormsg);
    if (bVar4) {
      HandleScriptArguments(this,&local_238,args,&SRArgumentSpecified);
      this_00 = &arg;
      std::__cxx11::string::string
                ((string *)&arg,
                 (string *)
                 ((args->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start + local_238));
      bVar4 = CheckArgument((cmCTest *)this_00,&arg,"-D","--dashboard");
      if ((bVar4) &&
         (pbVar2 = (args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start,
         local_238 <
         ((long)(args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2 >> 5) - 1U)) {
        ((this->Impl)._M_t.
         super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
         super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
         super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl)->ProduceXML = true;
        local_238 = local_238 + 1;
        std::__cxx11::string::string((string *)&targ,(string *)(pbVar2 + local_238));
        bVar4 = AddTestsForDashboardType(this,&targ);
        if ((!bVar4) && (bVar4 = AddVariableDefinition(this,&targ), !bVar4)) {
          ErrorMessageUnknownDashDValue(this,&targ);
          uVar11 = 0;
        }
        std::__cxx11::string::~string((string *)&targ);
      }
      bVar4 = std::operator!=(&arg,"-D");
      if ((bVar4) &&
         (bVar4 = cmsys::SystemTools::StringStartsWith(arg._M_dataplus._M_p,"-D"), bVar4)) {
        std::__cxx11::string::substr((ulong)&targ,(ulong)&arg);
        AddVariableDefinition(this,&targ);
        std::__cxx11::string::~string((string *)&targ);
      }
      bVar5 = HandleTestActionArgument(this,"ctest",&local_238,args);
      bVar6 = HandleTestModelArgument(this,"ctest",&local_238,args);
      bVar4 = std::operator==(&arg,"--extra-submit");
      if ((bVar4) &&
         (local_238 <
          ((long)(args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish -
           (long)(args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start >> 5) - 1U)) {
        ((this->Impl)._M_t.
         super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
         super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
         super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl)->ProduceXML = true;
        SetTest(this,"Submit",true);
        local_238 = local_238 + 1;
        bVar7 = SubmitExtraFiles(this,(args->
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start[local_238].
                                      _M_dataplus._M_p);
        bVar4 = false;
        if (bVar7) goto LAB_00148cbd;
        unaff_R13D = 0;
      }
      else {
LAB_00148cbd:
        bVar4 = std::operator==(&arg,"--build-and-test");
        if (bVar4) {
          local_230 = CONCAT31((int3)(local_230 >> 8),
                               (byte)local_230 |
                               local_238 <
                               ((long)(args->
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_finish -
                                (long)(args->
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start >> 5) - 1U);
        }
        bVar4 = std::operator==(&arg,"--schedule-random");
        if (bVar4) {
          std::__cxx11::string::assign
                    ((char *)&((this->Impl)._M_t.
                               super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                               .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl)->
                              ScheduleType);
        }
        local_22c = (uint)uVar11;
        Private::GetTestingHandlers
                  ((vector<cmCTestGenericHandler_*,_std::allocator<cmCTestGenericHandler_*>_> *)
                   &local_1e0,
                   (this->Impl)._M_t.
                   super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                   .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl);
        ppcVar3 = local_1e0._M_impl.super__Vector_impl_data._M_finish;
        ppcVar12 = local_1e0._M_impl.super__Vector_impl_data._M_start;
        do {
          bVar4 = ppcVar12 == ppcVar3;
          uVar1 = local_22c;
          if (bVar4) goto LAB_00148e02;
          iVar8 = (*(*ppcVar12)->_vptr_cmCTestGenericHandler[2])(*ppcVar12,&arg,&local_238,args);
          ppcVar12 = ppcVar12 + 1;
        } while (iVar8 != 0);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&targ);
        std::operator<<((ostream *)&targ,"Problem parsing command line arguments within a handler");
        uVar1 = local_22c;
        std::__cxx11::stringbuf::str();
        Log(this,7,
            "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmCTest.cxx"
            ,0x8e2,local_1c8[0],false);
        std::__cxx11::string::~string((string *)local_1c8);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&targ);
        unaff_R13D = 0;
LAB_00148e02:
        uVar11 = (ulong)uVar1;
        std::_Vector_base<cmCTestGenericHandler_*,_std::allocator<cmCTestGenericHandler_*>_>::
        ~_Vector_base(&local_1e0);
      }
      uVar11 = CONCAT71((int7)(uVar11 >> 8),(byte)uVar11 & (bVar5 && bVar6));
      std::__cxx11::string::~string((string *)&arg);
    }
    else {
      cmSystemTools::Error(&errormsg);
      bVar4 = false;
      unaff_R13D = 1;
    }
    std::__cxx11::string::~string((string *)&errormsg);
    if (!bVar4) {
      return unaff_R13D;
    }
    local_238 = local_238 + 1;
  } while( true );
}

Assistant:

int cmCTest::Run(std::vector<std::string>& args, std::string* output)
{
  const char* ctestExec = "ctest";
  bool cmakeAndTest = false;
  bool executeTests = true;
  bool SRArgumentSpecified = false;

  // copy the command line
  cmAppend(this->Impl->InitialCommandLineArguments, args);

  // process the command line arguments
  for (size_t i = 1; i < args.size(); ++i) {
    // handle the simple commandline arguments
    std::string errormsg;
    if (!this->HandleCommandLineArguments(i, args, errormsg)) {
      cmSystemTools::Error(errormsg);
      return 1;
    }

    // handle the script arguments -S -SR -SP
    this->HandleScriptArguments(i, args, SRArgumentSpecified);

    // --dashboard: handle a request for a dashboard
    std::string arg = args[i];
    if (this->CheckArgument(arg, "-D", "--dashboard") && i < args.size() - 1) {
      this->Impl->ProduceXML = true;
      i++;
      std::string targ = args[i];
      // AddTestsForDashboard parses the dashboard type and converts it
      // into the separate stages
      if (!this->AddTestsForDashboardType(targ)) {
        if (!this->AddVariableDefinition(targ)) {
          this->ErrorMessageUnknownDashDValue(targ);
          executeTests = false;
        }
      }
    }

    // If it's not exactly -D, but it starts with -D, then try to parse out
    // a variable definition from it, same as CMake does. Unsuccessful
    // attempts are simply ignored since previous ctest versions ignore
    // this too. (As well as many other unknown command line args.)
    //
    if (arg != "-D" && cmSystemTools::StringStartsWith(arg.c_str(), "-D")) {
      std::string input = arg.substr(2);
      this->AddVariableDefinition(input);
    }

    // --test-action: calls SetTest(<stage>, /*report=*/ false) to enable
    // the corresponding stage
    if (!this->HandleTestActionArgument(ctestExec, i, args)) {
      executeTests = false;
    }

    // --test-model: what type of test model
    if (!this->HandleTestModelArgument(ctestExec, i, args)) {
      executeTests = false;
    }

    // --extra-submit
    if (this->CheckArgument(arg, "--extra-submit") && i < args.size() - 1) {
      this->Impl->ProduceXML = true;
      this->SetTest("Submit");
      i++;
      if (!this->SubmitExtraFiles(args[i].c_str())) {
        return 0;
      }
    }

    // --build-and-test options
    if (this->CheckArgument(arg, "--build-and-test") && i < args.size() - 1) {
      cmakeAndTest = true;
    }

    // --schedule-random
    if (this->CheckArgument(arg, "--schedule-random")) {
      this->Impl->ScheduleType = "Random";
    }

    // pass the argument to all the handlers as well, but i may no longer be
    // set to what it was originally so I'm not sure this is working as
    // intended
    for (auto& handler : this->Impl->GetTestingHandlers()) {
      if (!handler->ProcessCommandLineArguments(arg, i, args)) {
        cmCTestLog(this, ERROR_MESSAGE,
                   "Problem parsing command line arguments within a handler");
        return 0;
      }
    }
  } // the close of the for argument loop

  // handle CTEST_PARALLEL_LEVEL environment variable
  if (!this->Impl->ParallelLevelSetInCli) {
    std::string parallel;
    if (cmSystemTools::GetEnv("CTEST_PARALLEL_LEVEL", parallel)) {
      int plevel = atoi(parallel.c_str());
      this->SetParallelLevel(plevel);
    }
  }

  // TestProgressOutput only supported if console supports it and not logging
  // to a file
  this->Impl->TestProgressOutput = this->Impl->TestProgressOutput &&
    !this->Impl->OutputLogFile && this->ProgressOutputSupportedByConsole();
#ifdef _WIN32
  if (this->Impl->TestProgressOutput) {
    // Disable output line buffering so we can print content without
    // a newline.
    std::setvbuf(stdout, nullptr, _IONBF, 0);
  }
#endif

  // now what should cmake do? if --build-and-test was specified then
  // we run the build and test handler and return
  if (cmakeAndTest) {
    return this->RunCMakeAndTest(output);
  }

  if (executeTests) {
    return this->ExecuteTests();
  }

  return 1;
}